

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::resize_symms(Omega_h *this,Reals *old_symms,Int old_dim,Int new_dim)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Reals RVar2;
  Read<double> local_50 [2];
  Read<double> local_30;
  Int local_20;
  Int local_1c;
  Int new_dim_local;
  Int old_dim_local;
  Reals *old_symms_local;
  
  local_20 = new_dim;
  local_1c = old_dim;
  _new_dim_local = old_symms;
  old_symms_local = (Reals *)this;
  if (old_dim == new_dim) {
    Read<double>::Read((Read<double> *)this,(Read<signed_char> *)old_symms);
    pvVar1 = extraout_RDX;
  }
  else if ((old_dim == 2) && (new_dim == 3)) {
    Read<double>::Read(&local_30,old_symms);
    resize_symms_tmpl<2,3>(this,&local_30);
    Read<double>::~Read(&local_30);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if ((old_dim != 3) || (new_dim != 2)) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x26);
    }
    Read<double>::Read(local_50,old_symms);
    resize_symms_tmpl<3,2>(this,local_50);
    Read<double>::~Read(local_50);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals resize_symms(Reals old_symms, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_symms;
  if (old_dim == 2 && new_dim == 3) return resize_symms_tmpl<2, 3>(old_symms);
  if (old_dim == 3 && new_dim == 2) return resize_symms_tmpl<3, 2>(old_symms);
  OMEGA_H_NORETURN(Reals());
}